

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PackedArray_test.cpp
# Opt level: O2

void __thiscall PackedArray_speed_Test::TestBody(PackedArray_speed_Test *this)

{
  uint uVar1;
  result_type rVar2;
  PackedArray *a;
  ostream *poVar3;
  int bits;
  uint32_t bitsPerItem;
  int iVar4;
  int i;
  long lVar5;
  bool bVar6;
  double dVar7;
  result_type local_1dc4;
  uniform_int_distribution<unsigned_int> distr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> val;
  vector<unsigned_int,_std::allocator<unsigned_int>_> offs;
  mt19937_64 eng;
  random_device rd;
  
  std::random_device::random_device(&rd);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::seed(&eng,(ulong)uVar1);
  distr._M_param._M_a = 0;
  distr._M_param._M_b = 0xffffffff;
  offs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  offs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  offs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&offs,0x8000000);
  val.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  val.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  val.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&val,0x8000000);
  iVar4 = 0x800;
  while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
    local_1dc4 = std::uniform_int_distribution<unsigned_int>::operator()(&distr,&eng);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&val,&local_1dc4);
    rVar2 = std::uniform_int_distribution<unsigned_int>::operator()(&distr,&eng);
    local_1dc4 = rVar2 & 0x7ff;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&offs,&local_1dc4);
  }
  for (bitsPerItem = 1; bitsPerItem != 0x20; bitsPerItem = bitsPerItem + 1) {
    a = PackedArray_create(bitsPerItem,0x800);
    for (lVar5 = 0; lVar5 != 0x8000000; lVar5 = lVar5 + 1) {
      PackedArray_set(a,offs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                        .super__Vector_impl_data._M_start[lVar5],
                      val.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar5]);
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,"bits=");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,bitsPerItem);
    std::operator<<(poVar3,"speed: ");
    dVar7 = relClockOffset();
    poVar3 = std::ostream::_M_insert<double>(128.0 / dVar7);
    poVar3 = std::operator<<(poVar3,"MEl");
    std::operator<<(poVar3,"\n");
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&val.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&offs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::random_device::~random_device(&rd);
  return;
}

Assistant:

TEST(PackedArray, speed) {
    std::random_device rd;     //Get a random seed from the OS entropy device, or whatever
    std::mt19937_64 eng(rd());
    std::uniform_int_distribution<uint32_t> distr;

    const unsigned tot = 128*1024*1024;
    const unsigned els = 2048;

    vector<uint32_t> offs;
    offs.reserve(tot);
    vector<uint32_t> val;
    val.reserve(tot);

    for (int a = 0; a < els; a++) {
        val.push_back(distr(eng));
        offs.push_back(distr(eng) & (els-1));
    }

    for (int bits = 1; bits < 32; bits++) {

        PackedArray *pa = PackedArray_create(bits, els);
        for(int i =0; i<tot; i++) {
            PackedArray_set(pa, offs[i], val[i]);
        }

        cerr << "bits="<<bits <<"speed: "<< tot / 1024 / 1024/ relClockOffset() << "MEl"<< "\n";
    }
}